

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::Type::ByteSizeLong(Type *this)

{
  uint uVar1;
  Rep *pRVar2;
  string *value;
  size_t sVar3;
  Type *value_00;
  size_t sVar4;
  uint index;
  void **ppvVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  lVar8 = (long)(this->fields_).super_RepeatedPtrFieldBase.current_size_;
  pRVar2 = (this->fields_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  lVar9 = lVar8 * 8;
  for (lVar7 = 0; lVar9 - lVar7 != 0; lVar7 = lVar7 + 8) {
    sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::Field>
                      (*(Field **)((long)ppvVar5 + lVar7));
    lVar8 = lVar8 + sVar3;
  }
  uVar1 = (this->oneofs_).super_RepeatedPtrFieldBase.current_size_;
  lVar8 = lVar8 + (ulong)uVar1;
  uVar6 = 0;
  index = 0;
  if (0 < (int)uVar1) {
    uVar6 = uVar1;
    index = 0;
  }
  for (; uVar6 != index; index = index + 1) {
    value_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->oneofs_).super_RepeatedPtrFieldBase,index);
    sVar3 = internal::WireFormatLite::StringSize(value_00);
    lVar8 = lVar8 + sVar3;
  }
  lVar9 = (long)(this->options_).super_RepeatedPtrFieldBase.current_size_;
  sVar3 = lVar8 + lVar9;
  pRVar2 = (this->options_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  for (lVar8 = 0; lVar9 * 8 != lVar8; lVar8 = lVar8 + 8) {
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::Option>
                      (*(Option **)((long)ppvVar5 + lVar8));
    sVar3 = sVar3 + sVar4;
  }
  value = (this->name_).ptr_;
  if (value->_M_string_length != 0) {
    sVar4 = internal::WireFormatLite::StringSize(value);
    sVar3 = sVar3 + sVar4 + 1;
  }
  if (this->source_context_ != (SourceContext *)0x0 && this != (Type *)_Type_default_instance_) {
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::SourceContext>
                      (this->source_context_);
    sVar3 = sVar3 + sVar4 + 1;
  }
  if (this->syntax_ != 0) {
    sVar4 = io::CodedOutputStream::VarintSize32SignExtended(this->syntax_);
    sVar3 = sVar3 + sVar4 + 1;
  }
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict2)sVar3;
    return sVar3;
  }
  sVar3 = internal::ComputeUnknownFieldsSize
                    (&(this->super_Message).super_MessageLite._internal_metadata_,sVar3,
                     &this->_cached_size_);
  return sVar3;
}

Assistant:

size_t Type::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.Type)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.Field fields = 2;
  total_size += 1UL * this->_internal_fields_size();
  for (const auto& msg : this->fields_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated string oneofs = 3;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(oneofs_.size());
  for (int i = 0, n = oneofs_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      oneofs_.Get(i));
  }

  // repeated .google.protobuf.Option options = 4;
  total_size += 1UL * this->_internal_options_size();
  for (const auto& msg : this->options_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // string name = 1;
  if (this->name().size() > 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_name());
  }

  // .google.protobuf.SourceContext source_context = 5;
  if (this->has_source_context()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *source_context_);
  }

  // .google.protobuf.Syntax syntax = 6;
  if (this->syntax() != 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_syntax());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}